

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTypedConstraint.cpp
# Opt level: O0

void __thiscall
btAngularLimit::set(btAngularLimit *this,btScalar low,btScalar high,btScalar _softness,
                   btScalar _biasFactor,btScalar _relaxationFactor)

{
  btScalar *in_RDI;
  float in_XMM0_Da;
  btScalar bVar1;
  float in_XMM1_Da;
  btScalar in_XMM2_Da;
  btScalar in_XMM3_Da;
  btScalar in_XMM4_Da;
  
  in_RDI[1] = (in_XMM1_Da - in_XMM0_Da) / 2.0;
  bVar1 = btNormalizeAngle(3.156079e-39);
  *in_RDI = bVar1;
  in_RDI[2] = in_XMM2_Da;
  in_RDI[3] = in_XMM3_Da;
  in_RDI[4] = in_XMM4_Da;
  return;
}

Assistant:

void btAngularLimit::set(btScalar low, btScalar high, btScalar _softness, btScalar _biasFactor, btScalar _relaxationFactor)
{
	m_halfRange = (high - low) / 2.0f;
	m_center = btNormalizeAngle(low + m_halfRange);
	m_softness =  _softness;
	m_biasFactor = _biasFactor;
	m_relaxationFactor = _relaxationFactor;
}